

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cc
# Opt level: O0

JSON __thiscall JSON::addDictionaryMember(JSON *this,string *key,JSON *val)

{
  bool bVar1;
  element_type *this_00;
  pointer pJVar2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON>_>_>
  *this_01;
  mapped_type *this_02;
  JSON *pJVar3;
  runtime_error *this_03;
  JSON_dictionary *in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  JSON JVar4;
  long local_a0;
  long local_98;
  string local_60;
  JSON local_40;
  long local_30;
  JSON_dictionary *obj;
  JSON *val_local;
  string *key_local;
  JSON *this_local;
  
  obj = in_RCX;
  val_local = val;
  key_local = key;
  this_local = this;
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)key);
  if (bVar1) {
    this_00 = std::__shared_ptr_access<JSON::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<JSON::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)key);
    pJVar2 = std::unique_ptr<JSON::JSON_value,_std::default_delete<JSON::JSON_value>_>::get
                       (&this_00->value);
    if (pJVar2 == (pointer)0x0) {
      local_98 = 0;
    }
    else {
      local_98 = __dynamic_cast(pJVar2,&JSON_value::typeinfo,&JSON_dictionary::typeinfo,0);
    }
    local_a0 = local_98;
  }
  else {
    local_a0 = 0;
  }
  local_30 = local_a0;
  if (local_a0 != 0) {
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)obj);
    if (bVar1) {
      JSON(&local_40,(JSON *)obj);
    }
    else {
      makeNull();
    }
    this_01 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON>_>_>
               *)(local_30 + 0x10);
    Writer::encode_string(&local_60,(string *)val_local);
    this_02 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON>_>_>
              ::operator[](this_01,&local_60);
    pJVar3 = operator=(this_02,&local_40);
    JSON(this,pJVar3);
    std::__cxx11::string::~string((string *)&local_60);
    ~JSON(&local_40);
    JVar4.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         extraout_RDX._M_pi;
    JVar4.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (JSON)JVar4.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>;
  }
  this_03 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_03,"JSON::addDictionaryMember called on non-dictionary");
  __cxa_throw(this_03,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

JSON
JSON::addDictionaryMember(std::string const& key, JSON const& val)
{
    if (auto* obj = m ? dynamic_cast<JSON_dictionary*>(m->value.get()) : nullptr) {
        return obj->members[Writer::encode_string(key)] = val.m ? val : makeNull();
    } else {
        throw std::runtime_error("JSON::addDictionaryMember called on non-dictionary");
    }
}